

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall
wallet::WalletBatch::WriteDescriptorDerivedCache
          (WalletBatch *this,CExtPubKey *xpub,uint256 *desc_id,uint32_t key_exp_index,
          uint32_t der_index)

{
  byte bVar1;
  pair<unsigned_int,_unsigned_int> this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  CExtPubKey *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ser_xpub;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>,_std::pair<unsigned_int,_unsigned_int>_>
  *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  WalletBatch *this_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff18;
  WalletBatch local_b1 [10];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = local_b1;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffee8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff18,(size_type)this_01,(allocator_type *)in_RDI);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffee8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffee8);
  CExtPubKey::Encode(in_RDI,(uchar *)in_RSI);
  std::make_pair<std::__cxx11::string_const&,uint256_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             (uint256 *)in_stack_fffffffffffffee8);
  this_00 = std::make_pair<unsigned_int&,unsigned_int&>
                      ((uint *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                       (uint *)in_stack_fffffffffffffee8);
  std::make_pair<std::pair<std::__cxx11::string,uint256>,std::pair<unsigned_int,unsigned_int>>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>
              *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             (pair<unsigned_int,_unsigned_int> *)in_stack_fffffffffffffee8);
  bVar1 = WriteIC<std::pair<std::pair<std::__cxx11::string,uint256>,std::pair<unsigned_int,unsigned_int>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (this_01,(pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>,_std::pair<unsigned_int,_unsigned_int>_>
                              *)in_RDI,in_RSI,this_00.second._3_1_);
  std::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>,_std::pair<unsigned_int,_unsigned_int>_>
  ::~pair(in_stack_fffffffffffffee8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>::
  ~pair(&in_stack_fffffffffffffee8->first);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteDescriptorDerivedCache(const CExtPubKey& xpub, const uint256& desc_id, uint32_t key_exp_index, uint32_t der_index)
{
    std::vector<unsigned char> ser_xpub(BIP32_EXTKEY_SIZE);
    xpub.Encode(ser_xpub.data());
    return WriteIC(std::make_pair(std::make_pair(DBKeys::WALLETDESCRIPTORCACHE, desc_id), std::make_pair(key_exp_index, der_index)), ser_xpub);
}